

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

int Bbl_ManCheck(Bbl_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  Vec_Str_t *pVVar4;
  int iVar5;
  
  pVVar4 = p->pObjs;
  if (pVVar4->nSize < 1) {
    iVar5 = 1;
  }
  else {
    uVar3 = 0;
    iVar5 = 1;
    do {
      pcVar2 = pVVar4->pArray;
      if (pcVar2 == (char *)0x0) {
        return iVar5;
      }
      if (((pcVar2[(ulong)uVar3 + 8] & 3U) == 0) && (*(int *)(pcVar2 + (ulong)uVar3 + 4) == -1)) {
        iVar5 = 0;
        printf("Bbl_ManCheck(): Node %d does not have function specified.\n",
               (ulong)*(uint *)(pcVar2 + uVar3));
      }
      if (((pcVar2[(ulong)uVar3 + 8] & 1U) != 0) && (*(int *)(pcVar2 + (ulong)uVar3 + 4) != -1)) {
        iVar5 = 0;
        printf("Bbl_ManCheck(): CI with %d has function specified.\n",
               (ulong)*(uint *)(pcVar2 + uVar3));
      }
      if (((pcVar2[(ulong)uVar3 + 8] & 2U) != 0) && (*(int *)(pcVar2 + (ulong)uVar3 + 4) != -1)) {
        iVar5 = 0;
        printf("Bbl_ManCheck(): CO with %d has function specified.\n",
               (ulong)*(uint *)(pcVar2 + uVar3));
      }
      iVar1 = *(int *)(pcVar2 + uVar3);
      if (((long)iVar1 < 0) || (p->vFaninNums->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/bbl/bblif.c"
                      ,0x10e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vFaninNums->pArray[iVar1] != *(uint *)(pcVar2 + (ulong)uVar3 + 8) >> 4) {
        iVar5 = 0;
        printf("Bbl_ManCheck(): Object %d has less fanins (%d) than declared (%d).\n");
      }
      uVar3 = uVar3 + (*(uint *)(pcVar2 + (ulong)uVar3 + 8) >> 4) * 4 + 0xc;
      pVVar4 = p->pObjs;
    } while ((int)uVar3 < pVVar4->nSize);
  }
  return iVar5;
}

Assistant:

int Bbl_ManCheck( Bbl_Man_t * p )
{
    Bbl_Obj_t * pObj;
    int h, RetValue = 1;
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
    {
        if ( Bbl_ObjIsNode(pObj) && pObj->Fnc == -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): Node %d does not have function specified.\n", pObj->Id );
        if ( Bbl_ObjIsCi(pObj) && pObj->Fnc != -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): CI with %d has function specified.\n", pObj->Id );
        if ( Bbl_ObjIsCo(pObj) && pObj->Fnc != -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): CO with %d has function specified.\n", pObj->Id );
        if ( Vec_IntEntry(p->vFaninNums, pObj->Id) != (int)pObj->nFanins )
            RetValue = 0, printf( "Bbl_ManCheck(): Object %d has less fanins (%d) than declared (%d).\n", 
                pObj->Id, Vec_IntEntry(p->vFaninNums, pObj->Id), pObj->nFanins );
    }
    return RetValue;
}